

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
mjs::interpreter::impl::auto_stack_update::~auto_stack_update(auto_stack_update *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  impl *piVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  uint32_t uVar4;
  
  piVar1 = this->parent_;
  psVar2 = (piVar1->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((((piVar1->stack_trace_).
         super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
         super__Vector_impl_data._M_start == psVar2) ||
       (psVar2[-1].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr))
      || (psVar2[-1].start != (this->pos_).start)) || (psVar2[-1].end != (this->pos_).end)) {
    __assert_fail("!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x4ee,"mjs::interpreter::impl::auto_stack_update::~auto_stack_update()");
  }
  (piVar1->stack_trace_).super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar2 + -1;
  p_Var3 = psVar2[-1].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  piVar1 = this->parent_;
  (piVar1->current_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->old_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  __r = &(this->old_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar1->current_extend_).file.
              super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  uVar4 = (this->old_extend_).end;
  (piVar1->current_extend_).start = (this->old_extend_).start;
  (piVar1->current_extend_).end = uVar4;
  p_Var3 = (this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = __r->_M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    return;
  }
  return;
}

Assistant:

~auto_stack_update() {
            assert(!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_);
            parent_.stack_trace_.pop_back();
            parent_.current_extend_ = old_extend_;
        }